

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManCleanValues(Rnm_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int i;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < p->vMap->nSize; iVar4 = iVar4 + 1) {
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vMap,iVar4);
    pGVar3 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  iVar4 = 0;
  while( true ) {
    if (p->vObjs->nSize <= iVar4) {
      return;
    }
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vObjs,iVar4);
    pGVar3 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void Rnm_ManCleanValues( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        pObj->Value = 0;
}